

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O3

pnode_t * alloc_pnode(s3wid_t w,int32 pos,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos)

{
  int iVar1;
  s3pid_t sVar2;
  pnode_t *ppVar3;
  
  ppVar3 = (pnode_t *)
           __ckd_calloc__(1,0x40,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                          ,0x10a);
  ppVar3->wid = w;
  ppVar3->ci = ci;
  ppVar3->lc = lc;
  ppVar3->rc = rc;
  ppVar3->pos = (int8)pos;
  sVar2 = mdef_phone_id_nearest(mdef,ci,lc,rc,wpos);
  ppVar3->pid = sVar2;
  ppVar3->succlist = (plink_s *)0x0;
  ppVar3->predlist = (plink_s *)0x0;
  ppVar3->next = (pnode_s *)0x0;
  iVar1 = n_pnode + 1;
  ppVar3->id = n_pnode;
  n_pnode = iVar1;
  ppVar3->startstate = (snode_s *)0x0;
  ppVar3->alloc_next = pnode_list;
  pnode_list = ppVar3;
  return ppVar3;
}

Assistant:

static pnode_t *
alloc_pnode(s3wid_t w, int32 pos,
            s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos)
{
    pnode_t *p;

    p = (pnode_t *) ckd_calloc(1, sizeof(*p));
    p->wid = w;
    p->ci = ci;
    p->lc = lc;
    p->rc = rc;
    p->pos = pos;

    p->pid = mdef_phone_id_nearest(mdef, ci, lc, rc, wpos);

    p->succlist = NULL;
    p->predlist = NULL;
    p->next = NULL;

    p->id = n_pnode++;

    p->startstate = NULL;

    p->alloc_next = pnode_list;
    pnode_list = p;

    return p;
}